

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_176f3f::ResourceReplacer::handleToken(ResourceReplacer *this,Token *token)

{
  token_type_e tVar1;
  string *name_00;
  size_type sVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  long lVar6;
  size_t in_RCX;
  void *__buf;
  QPDFObjectHandle local_50;
  undefined1 local_40 [8];
  string name;
  bool wrote;
  Token *token_local;
  ResourceReplacer *this_local;
  
  name.field_2._M_local_buf[0xf] = '\0';
  tVar1 = QPDFTokenizer::Token::getType(token);
  if (tVar1 == tt_name) {
    name_00 = QPDFTokenizer::Token::getValue_abi_cxx11_(token);
    QPDFObjectHandle::newName(&local_50,name_00);
    QPDFObjectHandle::getName_abi_cxx11_((string *)local_40,&local_50);
    QPDFObjectHandle::~QPDFObjectHandle(&local_50);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::count(&this->to_replace,(key_type *)local_40);
    if (sVar2 != 0) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               ::operator[](&this->to_replace,(key_type *)local_40);
      sVar4 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(pmVar3,&this->offset);
      if (sVar4 != 0) {
        QTC::TC("qpdf","QPDFAcroFormDocumentHelper replaced DA token",0);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[](&this->to_replace,(key_type *)local_40);
        pmVar5 = std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar3,&this->offset);
        QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)pmVar5,__buf,in_RCX);
        name.field_2._M_local_buf[0xf] = '\x01';
      }
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  QPDFTokenizer::Token::getRawValue_abi_cxx11_(token);
  lVar6 = std::__cxx11::string::length();
  this->offset = lVar6 + this->offset;
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
  }
  return;
}

Assistant:

void
ResourceReplacer::handleToken(QPDFTokenizer::Token const& token)
{
    bool wrote = false;
    if (token.getType() == QPDFTokenizer::tt_name) {
        std::string name = QPDFObjectHandle::newName(token.getValue()).getName();
        if (to_replace.count(name) && to_replace[name].count(offset)) {
            QTC::TC("qpdf", "QPDFAcroFormDocumentHelper replaced DA token");
            write(to_replace[name][offset]);
            wrote = true;
        }
    }
    offset += token.getRawValue().length();
    if (!wrote) {
        writeToken(token);
    }
}